

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

void __thiscall Vector<long_double>::destroy(Vector<long_double> *this)

{
  undefined4 *in_RDI;
  
  if ((*(long *)(in_RDI + 2) != 0) && (*(void **)(in_RDI + 2) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 2));
  }
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  return;
}

Assistant:

inline void Vector< T >::destroy() 
{
#ifdef DEBUG
    fprintf(stderr,"Vector<>::destroy()         |                   | adr =  %x \n", ptr_to_data);
#endif
    if (ptr_to_data != 0) 
	delete [] ptr_to_data; 
    else {
    }	

    num_elts = 0; ptr_to_data = (T*)0;
}